

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EngineInterfaceObject.cpp
# Opt level: O2

ScriptFunction *
Js::EngineInterfaceObject::CreateLibraryCodeScriptFunction
          (ScriptFunction *scriptFunction,JavascriptString *displayName,bool isConstructor,
          bool isJsBuiltIn,bool isPublic)

{
  FunctionInfo *pFVar1;
  code *pcVar2;
  Var this;
  bool bVar3;
  int iVar4;
  charcount_t cVar5;
  BOOL BVar6;
  charcount_t cVar7;
  FunctionProxy *pFVar8;
  undefined4 *puVar9;
  Type *pTVar10;
  DynamicTypeHandler *typeHandler;
  char16_t *string;
  char16_t *pcVar11;
  ParseableFunctionInfo *pPVar12;
  JavascriptString *this_00;
  FunctionBody *pFVar13;
  Type TVar14;
  ulong uVar15;
  char16_t *content;
  FunctionInfo *info;
  Var local_48;
  Var existingName;
  JavascriptString *funcName;
  
  existingName = displayName;
  pFVar8 = ScriptFunction::GetFunctionProxy(scriptFunction);
  if ((pFVar8->field_0x44 & 4) != 0) {
    return scriptFunction;
  }
  pTVar10 = (scriptFunction->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
            super_RecyclableObject.type.ptr;
  pFVar1 = (scriptFunction->super_ScriptFunctionBase).super_JavascriptFunction.functionInfo.ptr;
  funcName = (JavascriptString *)
             (((pTVar10->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
  TVar14 = pFVar1->attributes;
  if (isConstructor) {
    if ((TVar14 & ErrorOnNew) != None) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/EngineInterfaceObject.cpp"
                                  ,0x11d,
                                  "((scriptFunction->GetFunctionInfo()->GetAttributes() & FunctionInfo::Attributes::ErrorOnNew) == 0)"
                                  ,"Why is the function not constructable by default?");
      if (!bVar3) goto LAB_00a1f45f;
      *puVar9 = 0;
    }
  }
  else {
    if ((TVar14 & ErrorOnNew) != None) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/EngineInterfaceObject.cpp"
                                  ,0x110,
                                  "((info->GetAttributes() & FunctionInfo::Attributes::ErrorOnNew) == 0)"
                                  ,
                                  "Why are we trying to disable construction of a function that already isn\'t constructable?"
                                 );
      if (!bVar3) goto LAB_00a1f45f;
      *puVar9 = 0;
      TVar14 = pFVar1->attributes;
      pTVar10 = (scriptFunction->super_ScriptFunctionBase).super_JavascriptFunction.
                super_DynamicObject.super_RecyclableObject.type.ptr;
    }
    pFVar1->attributes = TVar14 | ErrorOnNew;
    iVar4 = (**(code **)(**(long **)(pTVar10 + 1) + 0x268))();
    if (iVar4 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/EngineInterfaceObject.cpp"
                                  ,0x116,
                                  "(scriptFunction->GetDynamicType()->GetTypeHandler()->IsDeferredTypeHandler())"
                                  ,
                                  "scriptFunction->GetDynamicType()->GetTypeHandler()->IsDeferredTypeHandler()"
                                 );
      if (!bVar3) goto LAB_00a1f45f;
      *puVar9 = 0;
    }
    typeHandler = JavascriptLibrary::GetDeferredFunctionWithLengthTypeHandler
                            ((JavascriptLibrary *)(funcName->super_RecyclableObject).type.ptr);
    DynamicTypeHandler::SetInstanceTypeHandler((DynamicObject *)scriptFunction,typeHandler,true);
  }
  this = existingName;
  if (isPublic) {
    string = (char16_t *)(**(code **)(*existingName + 0x328))(existingName);
    cVar5 = JavascriptString::GetLength((JavascriptString *)this);
    pcVar11 = PAL_wcsrchr(string,L'.');
    content = pcVar11 + 1;
    uVar15 = (long)content - (long)string;
    if (pcVar11 == (char16_t *)0x0) {
      content = (char16 *)0x0;
    }
    uVar15 = uVar15 >> 1 & 0xffffffff;
    if (pcVar11 == (char16_t *)0x0) {
      uVar15 = 0;
    }
    pFVar8 = ScriptFunction::GetFunctionProxy(scriptFunction);
    pPVar12 = FunctionProxy::EnsureDeserialized(pFVar8);
    (*(pPVar12->super_FunctionProxy).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[6])(pPVar12,string,(ulong)cVar5,uVar15);
    local_48 = (Var)0x0;
    BVar6 = JavascriptOperators::GetOwnProperty
                      (scriptFunction,0x106,&local_48,(ScriptContext *)funcName,
                       (PropertyValueInfo *)0x0);
    if (BVar6 == 0) {
LAB_00a1f347:
      if ((local_48 == (Var)0x0) || (BVar6 = JavascriptOperators::IsUndefined(local_48), BVar6 != 0)
         ) goto LAB_00a1f360;
    }
    else {
      this_00 = VarTo<Js::JavascriptString>(local_48);
      cVar7 = JavascriptString::GetLength(this_00);
      if (cVar7 != 0) goto LAB_00a1f347;
      local_48 = (Var)0x0;
LAB_00a1f360:
      if (content != (char16 *)0x0) {
        existingName = JavascriptString::NewCopyBuffer
                                 (content,cVar5 - (int)uVar15,(ScriptContext *)funcName);
      }
      (*(scriptFunction->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
        super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
        _vptr_IRecyclerVisitedObject[0x1e])(scriptFunction,0x106,existingName,2,0,0,0xf);
    }
    pFVar8 = ScriptFunction::GetFunctionProxy(scriptFunction);
    pFVar8->field_0x44 = pFVar8->field_0x44 | 4;
  }
  if (isJsBuiltIn) {
    pFVar8 = ScriptFunction::GetFunctionProxy(scriptFunction);
    pFVar8->field_0x44 = pFVar8->field_0x44 | 8;
    ScriptFunction::SetEnvironment(scriptFunction,(FrameDisplay *)&StrictNullFrameDisplay);
    pFVar8 = ScriptFunction::GetFunctionProxy(scriptFunction);
    FunctionProxy::EnsureDeserialized(pFVar8);
    bVar3 = ScriptFunction::HasFunctionBody(scriptFunction);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/EngineInterfaceObject.cpp"
                                  ,0x157,"(scriptFunction->HasFunctionBody())",
                                  "scriptFunction->HasFunctionBody()");
      if (!bVar3) {
LAB_00a1f45f:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar9 = 0;
    }
    pFVar13 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)scriptFunction);
    pFVar13->field_0x17d = pFVar13->field_0x17d | 4;
  }
  return scriptFunction;
}

Assistant:

ScriptFunction *EngineInterfaceObject::CreateLibraryCodeScriptFunction(ScriptFunction *scriptFunction, JavascriptString *displayName, bool isConstructor, bool isJsBuiltIn, bool isPublic)
    {
        if (scriptFunction->GetFunctionProxy()->IsPublicLibraryCode())
        {
            // this can happen when we re-initialize Intl for a different mode -- for instance, if we have the following JS:
            // print((1).toLocaleString())
            // print(new Intl.NumberFormat().format(1))
            // Intl will first get initialized for Number, and then will get re-initialized for all of Intl. This will cause
            // Number.prototype.toLocaleString to be registered twice, which breaks some of our assertions below.
            return scriptFunction;
        }

        ScriptContext *scriptContext = scriptFunction->GetScriptContext();

        if (!isConstructor)
        {
            // set the ErrorOnNew attribute to disallow construction. JsBuiltIn/Intl functions are usually regular ScriptFunctions
            // (not lambdas or class methods), so they are usually constructable by default.
            FunctionInfo *info = scriptFunction->GetFunctionInfo();
            AssertMsg((info->GetAttributes() & FunctionInfo::Attributes::ErrorOnNew) == 0, "Why are we trying to disable construction of a function that already isn't constructable?");
            info->SetAttributes((FunctionInfo::Attributes) (info->GetAttributes() | FunctionInfo::Attributes::ErrorOnNew));

            // Assert that the type handler is deferred to ensure that we aren't overwriting previous modifications.
            // Script functions start with deferred type handlers, which undefer as soon as any property is modified.
            // Since the function that is passed in should be an inline function expression, its type should still be deferred by the time it gets here.
            AssertOrFailFast(scriptFunction->GetDynamicType()->GetTypeHandler()->IsDeferredTypeHandler());

            // give the function a type handler with name and length but without prototype
            DynamicTypeHandler::SetInstanceTypeHandler(scriptFunction, scriptContext->GetLibrary()->GetDeferredFunctionWithLengthTypeHandler());
        }
        else
        {
            AssertMsg((scriptFunction->GetFunctionInfo()->GetAttributes() & FunctionInfo::Attributes::ErrorOnNew) == 0, "Why is the function not constructable by default?");
        }

        if (isPublic)
        {
            // Use GetSz rather than GetString because we use wcsrchr below, which expects a null-terminated string
            // Callers can pass in a string like "get compare" or "Intl.Collator.prototype.resolvedOptions" -- only for the
            // latter do we extract a shortName.
            const char16 *methodNameBuf = displayName->GetSz();
            charcount_t methodNameLength = displayName->GetLength();
            const char16 *shortName = wcsrchr(methodNameBuf, _u('.'));
            charcount_t shortNameOffset = 0;
            if (shortName != nullptr)
            {
                shortName++;
                shortNameOffset = static_cast<charcount_t>(shortName - methodNameBuf);
            }

            scriptFunction->GetFunctionProxy()->EnsureDeserialized()->SetDisplayName(methodNameBuf, methodNameLength, shortNameOffset);

            // handle the name property AFTER handling isConstructor, because this can initialize the function's deferred type
            Var existingName = nullptr;
            if (JavascriptOperators::GetOwnProperty(scriptFunction, PropertyIds::name, &existingName, scriptContext, nullptr))
            {
                JavascriptString *existingNameString = VarTo<JavascriptString>(existingName);
                if (existingNameString->GetLength() == 0)
                {
                    // Only overwrite the name of the function object if it was anonymous coming in
                    // If the input function was named, it is likely intentional
                    existingName = nullptr;
                }
            }

            if (existingName == nullptr || JavascriptOperators::IsUndefined(existingName))
            {
                // It is convenient to set the name here rather than in script, since it is often duplicated.
                JavascriptString *funcName = displayName;
                if (shortName)
                {
                    funcName = JavascriptString::NewCopyBuffer(shortName, methodNameLength - shortNameOffset, scriptContext);
                }

                scriptFunction->SetPropertyWithAttributes(PropertyIds::name, funcName, PropertyConfigurable, nullptr);
            }

            scriptFunction->GetFunctionProxy()->SetIsPublicLibraryCode();
        }

        if (isJsBuiltIn)
        {
            scriptFunction->GetFunctionProxy()->SetIsJsBuiltInCode();

            // This makes it so that the given scriptFunction can't reference/close over any outside variables,
            // which is desirable for JsBuiltIns (though currently not for Intl)
            scriptFunction->SetEnvironment(const_cast<FrameDisplay *>(&StrictNullFrameDisplay));

            // TODO(jahorto): investigate force-inlining Intl code
            scriptFunction->GetFunctionProxy()->EnsureDeserialized();
            AssertOrFailFast(scriptFunction->HasFunctionBody());
            scriptFunction->GetFunctionBody()->SetJsBuiltInForceInline();
        }

        return scriptFunction;
    }